

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

long __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,long,duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
          *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>_>_>
  __comp_01;
  bool bVar3;
  ulong uVar4;
  duckdb *pdVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  undefined1 auVar9 [16];
  long result_1;
  string local_58;
  long local_38;
  
  bVar3 = this->desc;
  iVar7 = this->CRN;
  iVar8 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_58._M_dataplus._M_p = (pointer)accessor;
  local_58._M_string_length = (size_type)accessor;
  local_58.field_2._M_local_buf[0] = bVar3;
  if (iVar7 == iVar8) {
    if (iVar7 != iVar6 && iVar1 != iVar6) {
      uVar4 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_58.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>>
                (v_t + iVar1,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    pdVar5 = (duckdb *)
             QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
             ::operator()(accessor,v_t + iVar7);
    bVar3 = duckdb::TryCast::Operation<long,long>((long)pdVar5,&local_38,false);
    if (!bVar3) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_58,pdVar5,auVar9._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_58);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar8 != iVar6 && iVar1 != iVar6) {
      uVar4 = (long)(iVar6 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_58.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar8 = this->FRN;
      iVar7 = this->CRN;
      iVar6 = this->end;
    }
    local_58._M_dataplus._M_p = (pointer)accessor;
    local_58._M_string_length = (size_type)accessor;
    local_58.field_2._M_local_buf[0] = bVar3;
    if (iVar7 != iVar6 && iVar8 != iVar6) {
      uVar4 = (long)(iVar6 * 8 + iVar8 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_58.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>>>
                (v_t + iVar8,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar8 = this->FRN;
    }
    pdVar5 = (duckdb *)
             QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
             ::operator()(accessor,v_t + iVar8);
    bVar3 = duckdb::TryCast::Operation<long,long>((long)pdVar5,&local_38,false);
    lVar2 = local_38;
    if (!bVar3) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_58,pdVar5,auVar9._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_58);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pdVar5 = (duckdb *)
             QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
             ::operator()(accessor,v_t + this->CRN);
    bVar3 = duckdb::TryCast::Operation<long,long>((long)pdVar5,&local_38,false);
    if (!bVar3) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>(&local_58,pdVar5,auVar9._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_58);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = (long)((double)(local_38 - lVar2) *
                      (this->RN -
                      (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                     (double)lVar2);
  }
  return local_38;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}